

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void testing::internal::
     SharedPayload<testing::internal::EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ::Destroy(SharedPayloadBase *shared)

{
  if ((shared != (SharedPayloadBase *)0x0) && (*(SharedPayloadBase **)(shared + 2) != shared + 6)) {
    operator_delete(*(SharedPayloadBase **)(shared + 2));
  }
  operator_delete(shared);
  return;
}

Assistant:

static void Destroy(SharedPayloadBase* shared) {
    delete static_cast<SharedPayload*>(shared);
  }